

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

Matrix3x3 * CGL::Matrix3x3::identity(void)

{
  double *pdVar1;
  Matrix3x3 *in_RDI;
  Matrix3x3 *B;
  
  Matrix3x3(in_RDI);
  pdVar1 = operator()(in_RDI,0,0);
  *pdVar1 = 1.0;
  pdVar1 = operator()(in_RDI,0,1);
  *pdVar1 = 0.0;
  pdVar1 = operator()(in_RDI,0,2);
  *pdVar1 = 0.0;
  pdVar1 = operator()(in_RDI,1,0);
  *pdVar1 = 0.0;
  pdVar1 = operator()(in_RDI,1,1);
  *pdVar1 = 1.0;
  pdVar1 = operator()(in_RDI,1,2);
  *pdVar1 = 0.0;
  pdVar1 = operator()(in_RDI,2,0);
  *pdVar1 = 0.0;
  pdVar1 = operator()(in_RDI,2,1);
  *pdVar1 = 0.0;
  pdVar1 = operator()(in_RDI,2,2);
  *pdVar1 = 1.0;
  return in_RDI;
}

Assistant:

Matrix3x3 Matrix3x3::identity( void ) {
    Matrix3x3 B;

    B(0,0) = 1.; B(0,1) = 0.; B(0,2) = 0.;
    B(1,0) = 0.; B(1,1) = 1.; B(1,2) = 0.;
    B(2,0) = 0.; B(2,1) = 0.; B(2,2) = 1.;

    return B;
  }